

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O2

uint64_t uv_get_free_memory(void)

{
  int iVar1;
  uint64_t uVar2;
  sysinfo info;
  sysinfo local_70;
  
  uVar2 = uv__read_proc_meminfo("MemAvailable:");
  if (uVar2 == 0) {
    iVar1 = sysinfo(&local_70);
    if (iVar1 == 0) {
      uVar2 = local_70.mem_unit * local_70.freeram;
    }
    else {
      uVar2 = 0;
    }
  }
  return uVar2;
}

Assistant:

uint64_t uv_get_free_memory(void) {
  struct sysinfo info;
  uint64_t rc;

  rc = uv__read_proc_meminfo("MemAvailable:");

  if (rc != 0)
    return rc;

  if (0 == sysinfo(&info))
    return (uint64_t) info.freeram * info.mem_unit;

  return 0;
}